

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

InsertionResult * __thiscall
QHashPrivate::Data<QHashPrivate::Node<QGraphicsObject*,QHashDummyValue>>::
findOrInsert<QGraphicsObject*>
          (InsertionResult *__return_storage_ptr__,
          Data<QHashPrivate::Node<QGraphicsObject*,QHashDummyValue>> *this,QGraphicsObject **key)

{
  size_t hash;
  ulong uVar1;
  bool bVar2;
  long in_FS_OFFSET;
  Bucket local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = (Bucket)ZEXT816(0);
  hash = qHash<QGraphicsObject_*,_true>(key,*(size_t *)(this + 0x18));
  if (*(long *)(this + 0x10) == 0) {
    uVar1 = *(ulong *)(this + 8);
LAB_005ad748:
    Data<QHashPrivate::Node<QGraphicsObject_*,_QHashDummyValue>_>::rehash
              ((Data<QHashPrivate::Node<QGraphicsObject_*,_QHashDummyValue>_> *)this,uVar1 + 1);
    local_38 = findBucketWithHash<QGraphicsObject*>(this,key,hash);
  }
  else {
    local_38 = findBucketWithHash<QGraphicsObject*>(this,key,hash);
    if ((local_38.span)->offsets[local_38.index] != 0xff) {
      uVar1 = ((long)local_38.span - *(long *)(this + 0x20)) / 0x90 << 7 | local_38.index;
      bVar2 = true;
      goto LAB_005ad794;
    }
    uVar1 = *(ulong *)(this + 8);
    if (*(ulong *)(this + 0x10) >> 1 <= uVar1) goto LAB_005ad748;
  }
  Data<QHashPrivate::Node<QGraphicsObject_*,_QHashDummyValue>_>::Bucket::insert(&local_38);
  *(long *)(this + 8) = *(long *)(this + 8) + 1;
  uVar1 = ((long)local_38.span - *(long *)(this + 0x20)) / 0x90 << 7 | local_38.index;
  bVar2 = false;
LAB_005ad794:
  (__return_storage_ptr__->it).d =
       (Data<QHashPrivate::Node<QGraphicsObject_*,_QHashDummyValue>_> *)this;
  (__return_storage_ptr__->it).bucket = uVar1;
  __return_storage_ptr__->initialized = bVar2;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

InsertionResult findOrInsert(const K &key) noexcept
    {
        Bucket it(static_cast<Span *>(nullptr), 0);
        size_t hash = QHashPrivate::calculateHash(key, seed);
        if (numBuckets > 0) {
            it = findBucketWithHash(key, hash);
            if (!it.isUnused())
                return { it.toIterator(this), true };
        }
        if (shouldGrow()) {
            rehash(size + 1);
            it = findBucketWithHash(key, hash); // need to get a new iterator after rehashing
        }
        Q_ASSERT(it.span != nullptr);
        Q_ASSERT(it.isUnused());
        it.insert();
        ++size;
        return { it.toIterator(this), false };
    }